

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O1

bool ContainsData(ScopeData *scope,bool checkImported)

{
  uint uVar1;
  TypeBase *pTVar2;
  FunctionData **ppFVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar6 = (ulong)(scope->types).count;
  bVar7 = uVar6 != 0;
  if (bVar7) {
    uVar5 = 1;
    do {
      pTVar2 = (scope->types).data[uVar5 - 1];
      bVar8 = false;
      if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x18)) {
        bVar8 = pTVar2->importModule != (ModuleData *)0x0;
      }
      if (bVar8 == checkImported) {
        if (bVar7) {
          return true;
        }
        break;
      }
      bVar7 = uVar5 < uVar6;
      bVar8 = uVar5 != uVar6;
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  uVar6 = (ulong)(scope->functions).count;
  bVar7 = uVar6 != 0;
  if (bVar7) {
    ppFVar3 = (scope->functions).data;
    if (((*ppFVar3)->importModule == (ModuleData *)0x0) == checkImported) {
      uVar5 = 0;
      do {
        if (uVar6 - 1 == uVar5) goto LAB_00140ac7;
        lVar4 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while ((ppFVar3[lVar4]->importModule == (ModuleData *)0x0) == checkImported);
      bVar7 = uVar5 < uVar6;
    }
    if (bVar7) {
      return true;
    }
  }
LAB_00140ac7:
  if (((scope->ownerFunction == (FunctionData *)0x0) ||
      ((scope->ownerFunction->importModule != (ModuleData *)0x0) == checkImported)) &&
     (uVar6 = (ulong)(scope->variables).count, uVar6 != 0)) {
    uVar5 = 0;
    do {
      if (((scope->variables).data[uVar5]->importModule == (ModuleData *)0x0) != checkImported) {
        return true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  uVar6 = (ulong)(scope->aliases).count;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      if (((scope->aliases).data[uVar5]->importModule == (ModuleData *)0x0) != checkImported) {
        return true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  bVar7 = (scope->scopes).count != 0;
  if ((bVar7) && (bVar8 = ContainsData(*(scope->scopes).data,checkImported), !bVar8)) {
    uVar1 = (scope->scopes).count;
    uVar6 = 1;
    do {
      bVar7 = uVar6 < uVar1;
      if (!bVar7) {
        return bVar7;
      }
      bVar8 = ContainsData((scope->scopes).data[uVar6],checkImported);
      uVar6 = uVar6 + 1;
    } while (!bVar8);
  }
  return bVar7;
}

Assistant:

bool ContainsData(ScopeData *scope, bool checkImported)
{
	for(unsigned i = 0; i < scope->types.size(); i++)
	{
		TypeBase *data = scope->types[i];

		bool imported = getType<TypeClass>(data) && getType<TypeClass>(data)->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->functions.size(); i++)
	{
		bool imported = scope->functions[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	bool ownerFunctionImported = scope->ownerFunction && scope->ownerFunction->importModule != NULL;

	if(!scope->ownerFunction || checkImported == ownerFunctionImported)
	{
		for(unsigned i = 0; i < scope->variables.size(); i++)
		{
			bool imported = scope->variables[i]->importModule != NULL;

			if(checkImported == imported)
				return true;
		}
	}

	for(unsigned i = 0; i < scope->aliases.size(); i++)
	{
		bool imported = scope->aliases[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->scopes.size(); i++)
	{
		if(ContainsData(scope->scopes[i], checkImported))
			return true;
	}

	return false;
}